

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int WebRtcIsac_EncodeStoredDataUb
              (ISACUBSaveEncDataStruct *ISACSavedEnc_obj,Bitstr *bitStream,int32_t jitterInfo,
              float scale,ISACBandwidth bandwidth)

{
  int16_t iVar1;
  int iVar2;
  long lVar3;
  uint16_t **cdf;
  int16_t *fi;
  int16_t *fr;
  bool bVar4;
  double lpcGain [6];
  int16_t imagFFT [240];
  int16_t realFFT [240];
  
  bitStream->W_upper = 0xffffffff;
  bitStream->streamval = 0;
  bitStream->stream_index = 0;
  WebRtcIsac_EncodeJitterInfo(jitterInfo,bitStream);
  iVar1 = WebRtcIsac_EncodeBandwidth(bandwidth,bitStream);
  if (iVar1 < 0) {
    iVar2 = (int)iVar1;
  }
  else {
    bVar4 = bandwidth != isac12kHz;
    if (bVar4) {
      cdf = WebRtcIsac_kLpcShapeCdfMatUb16;
    }
    else {
      cdf = WebRtcIsac_kLpcShapeCdfMatUb12;
    }
    WebRtcIsac_EncHistMulti(bitStream,ISACSavedEnc_obj->indexLPCShape,cdf,(uint)bVar4 * 8 + 8);
    if ((scale <= 0.0) || (1.0 <= scale)) {
      WebRtcIsac_EncHistMulti(bitStream,ISACSavedEnc_obj->lpcGainIndex,WebRtcIsac_kLpcGainCdfMat,6);
      if (bandwidth == isac16kHz) {
        WebRtcIsac_EncHistMulti
                  (bitStream,ISACSavedEnc_obj->lpcGainIndex + 6,WebRtcIsac_kLpcGainCdfMat,6);
      }
      fr = ISACSavedEnc_obj->realFFT;
      fi = ISACSavedEnc_obj->imagFFT;
    }
    else {
      for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
        lpcGain[lVar3] = ISACSavedEnc_obj->lpcGain[lVar3] * (double)scale;
      }
      WebRtcIsac_StoreLpcGainUb(lpcGain,bitStream);
      if (bandwidth == isac16kHz) {
        for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
          lpcGain[lVar3] = ISACSavedEnc_obj->lpcGain[lVar3 + 6] * (double)scale;
        }
        WebRtcIsac_StoreLpcGainUb(lpcGain,bitStream);
      }
      for (lVar3 = 0; lVar3 != 0xf0; lVar3 = lVar3 + 1) {
        realFFT[lVar3] = (int16_t)(int)((float)(int)ISACSavedEnc_obj->realFFT[lVar3] * scale + 0.5);
        imagFFT[lVar3] = (int16_t)(int)((float)(int)ISACSavedEnc_obj->imagFFT[lVar3] * scale + 0.5);
      }
      fr = realFFT;
      fi = imagFFT;
    }
    iVar2 = WebRtcIsac_EncodeSpec(fr,fi,0,bVar4 + kIsacUpperBand12,bitStream);
    if (-1 < iVar2) {
      iVar2 = WebRtcIsac_EncTerminate(bitStream);
    }
  }
  return iVar2;
}

Assistant:

int WebRtcIsac_EncodeStoredDataUb(
    const ISACUBSaveEncDataStruct* ISACSavedEnc_obj,
    Bitstr* bitStream,
    int32_t jitterInfo,
    float scale,
    enum ISACBandwidth bandwidth) {
  int n;
  int err;
  double lpcGain[SUBFRAMES];
  int16_t realFFT[FRAMESAMPLES_HALF];
  int16_t imagFFT[FRAMESAMPLES_HALF];
  const uint16_t** shape_cdf;
  int shape_len;
  const int16_t kAveragePitchGain = 0.0;
  enum ISACBand band;
  /* Reset bitstream. */
  WebRtcIsac_ResetBitstream(bitStream);

  /* Encode jitter index. */
  WebRtcIsac_EncodeJitterInfo(jitterInfo, bitStream);

  err = WebRtcIsac_EncodeBandwidth(bandwidth, bitStream);
  if (err < 0) {
    return err;
  }

  /* Encode LPC-shape. */
  if (bandwidth == isac12kHz) {
    shape_cdf = WebRtcIsac_kLpcShapeCdfMatUb12;
    shape_len = UB_LPC_ORDER * UB_LPC_VEC_PER_FRAME;
    band = kIsacUpperBand12;
  } else {
    shape_cdf = WebRtcIsac_kLpcShapeCdfMatUb16;
    shape_len = UB_LPC_ORDER * UB16_LPC_VEC_PER_FRAME;
    band = kIsacUpperBand16;
  }
  WebRtcIsac_EncHistMulti(bitStream, ISACSavedEnc_obj->indexLPCShape,
                          shape_cdf, shape_len);

  if ((scale <= 0.0) || (scale >= 1.0)) {
    /* We only consider scales between zero and one. */
    WebRtcIsac_EncHistMulti(bitStream, ISACSavedEnc_obj->lpcGainIndex,
                            WebRtcIsac_kLpcGainCdfMat, UB_LPC_GAIN_DIM);
    if (bandwidth == isac16kHz) {
      /* Store gain indices of the second half. */
      WebRtcIsac_EncHistMulti(bitStream,
                              &ISACSavedEnc_obj->lpcGainIndex[SUBFRAMES],
                              WebRtcIsac_kLpcGainCdfMat, UB_LPC_GAIN_DIM);
    }
    /* Store FFT coefficients. */
    err = WebRtcIsac_EncodeSpec(ISACSavedEnc_obj->realFFT,
                                ISACSavedEnc_obj->imagFFT, kAveragePitchGain,
                                band, bitStream);
  } else {
    /* Scale LPC gain and FFT coefficients. */
    for (n = 0; n < SUBFRAMES; n++) {
      lpcGain[n] = scale * ISACSavedEnc_obj->lpcGain[n];
    }
    /* Store LPC gains. */
    WebRtcIsac_StoreLpcGainUb(lpcGain, bitStream);

    if (bandwidth == isac16kHz) {
      /* Scale and code the gains of the second half of the frame, if 16kHz. */
      for (n = 0; n < SUBFRAMES; n++) {
        lpcGain[n] = scale * ISACSavedEnc_obj->lpcGain[n + SUBFRAMES];
      }
      WebRtcIsac_StoreLpcGainUb(lpcGain, bitStream);
    }

    for (n = 0; n < FRAMESAMPLES_HALF; n++) {
      realFFT[n] = (int16_t)(scale * (float)ISACSavedEnc_obj->realFFT[n] +
          0.5f);
      imagFFT[n] = (int16_t)(scale * (float)ISACSavedEnc_obj->imagFFT[n] +
          0.5f);
    }
    /* Store FFT coefficients. */
    err = WebRtcIsac_EncodeSpec(realFFT, imagFFT, kAveragePitchGain,
                                band, bitStream);
  }
  if (err < 0) {
    /* Error happened while encoding FFT coefficients. */
    return err;
  }

  /* Complete arithmetic coding. */
  return WebRtcIsac_EncTerminate(bitStream);
}